

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O0

void __thiscall DSaveMenu::DoSave(DSaveMenu *this,FSaveGameNode *node)

{
  char *pcVar1;
  FString local_38;
  FILE *local_30;
  FILE *test;
  int i;
  FString filename;
  FSaveGameNode *node_local;
  DSaveMenu *this_local;
  
  filename.Chars = node->Title;
  if (node == &this->NewSaveNode) {
    FString::FString((FString *)&stack0xffffffffffffffe0);
    test._4_4_ = 0;
    while( true ) {
      G_BuildSaveName((char *)&local_38,0xa026a9);
      FString::operator=((FString *)&stack0xffffffffffffffe0,&local_38);
      FString::~FString(&local_38);
      pcVar1 = FString::operator_cast_to_char_((FString *)&stack0xffffffffffffffe0);
      local_30 = fopen(pcVar1,"rb");
      if (local_30 == (FILE *)0x0) break;
      fclose(local_30);
      test._4_4_ = test._4_4_ + 1;
    }
    pcVar1 = FString::operator_cast_to_char_((FString *)&stack0xffffffffffffffe0);
    G_SaveGame(pcVar1,(this->super_DLoadSaveMenu).savegamestring);
    FString::~FString((FString *)&stack0xffffffffffffffe0);
  }
  else {
    pcVar1 = FString::GetChars(&node->Filename);
    G_SaveGame(pcVar1,(this->super_DLoadSaveMenu).savegamestring);
  }
  M_ClearMenus();
  V_SetBorderNeedRefresh();
  return;
}

Assistant:

void DSaveMenu::DoSave (FSaveGameNode *node)
{
	if (node != &NewSaveNode)
	{
		G_SaveGame (node->Filename.GetChars(), savegamestring);
	}
	else
	{
		// Find an unused filename and save as that
		FString filename;
		int i;
		FILE *test;

		for (i = 0;; ++i)
		{
			filename = G_BuildSaveName ("save", i);
			test = fopen (filename, "rb");
			if (test == NULL)
			{
				break;
			}
			fclose (test);
		}
		G_SaveGame (filename, savegamestring);
	}
	M_ClearMenus();
	V_SetBorderNeedRefresh();
}